

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zopflipng_bin.cc
# Opt level: O2

void GetFileNameParts(string *filename,string *dir,string *file,string *ext)

{
  long lVar1;
  string nodir;
  string local_50 [32];
  
  lVar1 = std::__cxx11::string::find_last_of((char *)filename,0x12405c);
  nodir._M_dataplus._M_p = (pointer)&nodir.field_2;
  nodir._M_string_length = 0;
  nodir.field_2._M_local_buf[0] = '\0';
  if (lVar1 == -1) {
    std::__cxx11::string::assign((char *)dir);
    std::__cxx11::string::_M_assign((string *)&nodir);
  }
  else {
    std::__cxx11::string::substr((ulong)local_50,(ulong)filename);
    std::__cxx11::string::operator=((string *)dir,local_50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::substr((ulong)local_50,(ulong)filename);
    std::__cxx11::string::operator=((string *)&nodir,local_50);
    std::__cxx11::string::~string(local_50);
  }
  lVar1 = std::__cxx11::string::rfind((char)&nodir,0x2e);
  if (lVar1 == -1) {
    std::__cxx11::string::_M_assign((string *)file);
    std::__cxx11::string::assign((char *)ext);
  }
  else {
    std::__cxx11::string::substr((ulong)local_50,(ulong)&nodir);
    std::__cxx11::string::operator=((string *)file,local_50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::substr((ulong)local_50,(ulong)&nodir);
    std::__cxx11::string::operator=((string *)ext,local_50);
    std::__cxx11::string::~string(local_50);
  }
  std::__cxx11::string::~string((string *)&nodir);
  return;
}

Assistant:

void GetFileNameParts(const std::string& filename,
    std::string* dir, std::string* file, std::string* ext) {
  size_t npos = (size_t)(-1);
  size_t slashpos = filename.find_last_of("/\\");
  std::string nodir;
  if (slashpos == npos) {
    *dir = "";
    nodir = filename;
  } else {
    *dir = filename.substr(0, slashpos + 1);
    nodir = filename.substr(slashpos + 1);
  }
  size_t dotpos = nodir.find_last_of('.');
  if (dotpos == (size_t)(-1)) {
    *file = nodir;
    *ext = "";
  } else {
    *file = nodir.substr(0, dotpos);
    *ext = nodir.substr(dotpos);
  }
}